

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

wrapper<std::unique_ptr<impl1,_std::default_delete<i1>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_*>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<must_be_bound,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,double>,boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::core::array<float>,std::initializer_list<float>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<int>,boost::ext::di::v1_3_0::core::array<int,int,int>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,impl1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,impl1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::unique_ptr<impl1,std::default_delete<i1>>,boost::ext::di::v1_3_0::no_name>
          (injector<must_be_bound,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<false,boost::ext::di::v1_3_0::policies::detail::or_<std::is_same<boost::ext::di::v1_3_0::_,double>,boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::core::array<float>,std::initializer_list<float>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<int>,boost::ext::di::v1_3_0::core::array<int,int,int>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,impl1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,impl1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
           *this)

{
  wrapper<std::unique_ptr<impl1,_std::default_delete<i1>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_*>_>
  wVar1;
  
  wVar1.wrapper_.object = (unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_*>)operator_new(8);
  *(undefined ***)wVar1.wrapper_.object = &PTR__i1_00106ce0;
  return (wrapper<std::unique_ptr<impl1,_std::default_delete<i1>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_*>_>
          )wVar1.wrapper_.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    using ctor_args_t = typename ctor_t::second::second;
    policy::template call<arg_wrapper<T, TName, TIsRoot, ctor_args_t, dependency_t, pool_t>>(
        ((injector*)this)->cfg().policies(this));
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }